

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O1

IUINT32 ikcp_check(ikcpcb *kcp,IUINT32 current)

{
  IUINT32 IVar1;
  uint uVar2;
  uint uVar3;
  IKCPSEG *seg;
  IQUEUEHEAD *pIVar4;
  uint uVar5;
  
  if (kcp->updated != 0) {
    IVar1 = kcp->ts_flush;
    if ((current - kcp->ts_flush) - 10000 < 0xffffb1e0) {
      IVar1 = current;
    }
    if ((int)(current - IVar1) < 0) {
      uVar3 = 0x7fffffff;
      pIVar4 = &kcp->snd_buf;
      do {
        pIVar4 = pIVar4->next;
        if (pIVar4 == &kcp->snd_buf) {
          uVar2 = IVar1 - current;
          if ((int)uVar3 < (int)(IVar1 - current)) {
            uVar2 = uVar3;
          }
          if (kcp->interval <= uVar2) {
            uVar2 = kcp->interval;
          }
          return uVar2 + current;
        }
        uVar5 = *(int *)&pIVar4[3].next - current;
        uVar2 = uVar5;
        if ((int)uVar3 < (int)uVar5) {
          uVar2 = uVar3;
        }
        uVar3 = uVar2;
      } while (0 < (int)uVar5);
    }
  }
  return current;
}

Assistant:

IUINT32 ikcp_check(const ikcpcb *kcp, IUINT32 current)
{
	IUINT32 ts_flush = kcp->ts_flush;
	IINT32 tm_flush = 0x7fffffff;
	IINT32 tm_packet = 0x7fffffff;
	IUINT32 minimal = 0;
	struct IQUEUEHEAD *p;

	if (kcp->updated == 0) {
		return current;
	}

	if (_itimediff(current, ts_flush) >= 10000 ||
		_itimediff(current, ts_flush) < -10000) {
		ts_flush = current;
	}

	if (_itimediff(current, ts_flush) >= 0) {
		return current;
	}

	tm_flush = _itimediff(ts_flush, current);

	for (p = kcp->snd_buf.next; p != &kcp->snd_buf; p = p->next) {
		const IKCPSEG *seg = iqueue_entry(p, const IKCPSEG, node);
		IINT32 diff = _itimediff(seg->resendts, current);
		if (diff <= 0) {
			return current;
		}
		if (diff < tm_packet) tm_packet = diff;
	}

	minimal = (IUINT32)(tm_packet < tm_flush ? tm_packet : tm_flush);
	if (minimal >= kcp->interval) minimal = kcp->interval;

	return current + minimal;
}